

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(mbedtls_mpi_uint *N)

{
  undefined4 local_1c;
  ulong uStack_18;
  uint i;
  mbedtls_mpi_uint x;
  mbedtls_mpi_uint *N_local;
  
  uStack_18 = (*N + 2 & 4) * 2 + *N;
  for (local_1c = 0x40; 7 < local_1c; local_1c = local_1c >> 1) {
    uStack_18 = (2 - *N * uStack_18) * uStack_18;
  }
  return (uStack_18 ^ 0xffffffffffffffff) + 1;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_montmul_init(const mbedtls_mpi_uint *N)
{
    mbedtls_mpi_uint x = N[0];

    x += ((N[0] + 2) & 4) << 1;

    for (unsigned int i = biL; i >= 8; i /= 2) {
        x *= (2 - (N[0] * x));
    }

    return ~x + 1;
}